

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fglrx.c
# Opt level: O0

void decode_fglrx_ioctl_drv_info(fglrx_ioctl_drv_info *d,mmt_memory_dump *args,int argc)

{
  int iVar1;
  mmt_buf *local_60;
  mmt_buf *__ret_2;
  mmt_buf *drv_name;
  mmt_buf *local_48;
  mmt_buf *__ret_1;
  mmt_buf *drv_date;
  mmt_buf *local_30;
  mmt_buf *__ret;
  mmt_buf *drv_id;
  int argc_local;
  mmt_memory_dump *args_local;
  fglrx_ioctl_drv_info *d_local;
  
  if ((d->unk00 != 0) || (iVar1 = _fglrx_field_enabled("unk00"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk00: 0x%08x",fglrx_pfx,(ulong)d->unk00);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk04 != 0) || (iVar1 = _fglrx_field_enabled("unk04"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk04: 0x%08x",fglrx_pfx,(ulong)d->unk04);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk08 != 0) || (iVar1 = _fglrx_field_enabled("unk08"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk08: 0x%08x",fglrx_pfx,(ulong)d->unk08);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk0c != 0) || (iVar1 = _fglrx_field_enabled("unk0c"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk0c: 0x%08x",fglrx_pfx,(ulong)d->unk0c);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->drv_id_len != 0) || (iVar1 = _fglrx_field_enabled("drv_id_len"), iVar1 != 0)) {
    fprintf(_stdout,"%sdrv_id_len: %d",fglrx_pfx,(ulong)d->drv_id_len);
  }
  fglrx_pfx = fglrx_sep;
  if (d->_pad14 != 0) {
    fprintf(_stdout,"%s%s_pad14: 0x%08x%s",fglrx_sep,colors->err,(ulong)d->_pad14,colors->reset);
  }
  fglrx_pfx = fglrx_sep;
  local_30 = (mmt_buf *)0x0;
  if ((d->drv_id != 0) || (iVar1 = _fglrx_field_enabled("drv_id"), iVar1 != 0)) {
    if (d->drv_id == 0) {
      fprintf(_stdout,"%sdrv_id: %s",fglrx_pfx,"NULL");
    }
    else {
      fprintf(_stdout,"%sdrv_id: 0x%016lx",fglrx_pfx,d->drv_id);
      if (0 < argc) {
        local_30 = find_ptr(d->drv_id,args,argc);
      }
      if (local_30 == (mmt_buf *)0x0) {
        fprintf(_stdout,"%s"," [no data]");
      }
    }
  }
  fglrx_pfx = fglrx_sep;
  if ((d->drv_date_len != 0) || (iVar1 = _fglrx_field_enabled("drv_date_len"), iVar1 != 0)) {
    fprintf(_stdout,"%sdrv_date_len: %d",fglrx_pfx,(ulong)d->drv_date_len);
  }
  fglrx_pfx = fglrx_sep;
  if (d->_pad24 != 0) {
    fprintf(_stdout,"%s%s_pad24: 0x%08x%s",fglrx_sep,colors->err,(ulong)d->_pad24,colors->reset);
  }
  fglrx_pfx = fglrx_sep;
  local_48 = (mmt_buf *)0x0;
  if ((d->drv_date != 0) || (iVar1 = _fglrx_field_enabled("drv_date"), iVar1 != 0)) {
    if (d->drv_date == 0) {
      fprintf(_stdout,"%sdrv_date: %s",fglrx_pfx,"NULL");
    }
    else {
      fprintf(_stdout,"%sdrv_date: 0x%016lx",fglrx_pfx,d->drv_date);
      if (0 < argc) {
        local_48 = find_ptr(d->drv_date,args,argc);
      }
      if (local_48 == (mmt_buf *)0x0) {
        fprintf(_stdout,"%s"," [no data]");
      }
    }
  }
  fglrx_pfx = fglrx_sep;
  if ((d->drv_name_len != 0) || (iVar1 = _fglrx_field_enabled("drv_name_len"), iVar1 != 0)) {
    fprintf(_stdout,"%sdrv_name_len: %d",fglrx_pfx,(ulong)d->drv_name_len);
  }
  fglrx_pfx = fglrx_sep;
  if (d->_pad34 != 0) {
    fprintf(_stdout,"%s%s_pad34: 0x%08x%s",fglrx_sep,colors->err,(ulong)d->_pad34,colors->reset);
  }
  fglrx_pfx = fglrx_sep;
  local_60 = (mmt_buf *)0x0;
  if ((d->drv_name != 0) || (iVar1 = _fglrx_field_enabled("drv_name"), iVar1 != 0)) {
    if (d->drv_name == 0) {
      fprintf(_stdout,"%sdrv_name: %s",fglrx_pfx,"NULL");
    }
    else {
      fprintf(_stdout,"%sdrv_name: 0x%016lx",fglrx_pfx,d->drv_name);
      if (0 < argc) {
        local_60 = find_ptr(d->drv_name,args,argc);
      }
      if (local_60 == (mmt_buf *)0x0) {
        fprintf(_stdout,"%s"," [no data]");
      }
    }
  }
  fglrx_pfx = fglrx_sep;
  fprintf(_stdout,"\n");
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  if (local_30 != (mmt_buf *)0x0) {
    dump_mmt_buf_as_text(local_30,"drv_id");
  }
  if (local_48 != (mmt_buf *)0x0) {
    dump_mmt_buf_as_text(local_48,"drv_date");
  }
  if (local_60 != (mmt_buf *)0x0) {
    dump_mmt_buf_as_text(local_60,"drv_name");
  }
  return;
}

Assistant:

static void decode_fglrx_ioctl_drv_info(struct fglrx_ioctl_drv_info *d, struct mmt_memory_dump *args, int argc)
{
	fglrx_print_x32(d, unk00);
	fglrx_print_x32(d, unk04);
	fglrx_print_x32(d, unk08);
	fglrx_print_x32(d, unk0c);
	fglrx_print_d32(d, drv_id_len);
	fglrx_print_pad_x32(d, _pad14);
	struct mmt_buf *drv_id = fglrx_print_ptr(d, drv_id, args, argc);
	fglrx_print_d32(d, drv_date_len);
	fglrx_print_pad_x32(d, _pad24);
	struct mmt_buf *drv_date = fglrx_print_ptr(d, drv_date, args, argc);
	fglrx_print_d32(d, drv_name_len);
	fglrx_print_pad_x32(d, _pad34);
	struct mmt_buf *drv_name = fglrx_print_ptr(d, drv_name, args, argc);
	mmt_log_cont_nl();

	if (drv_id)
		dump_mmt_buf_as_text(drv_id, "drv_id");
	if (drv_date)
		dump_mmt_buf_as_text(drv_date, "drv_date");
	if (drv_name)
		dump_mmt_buf_as_text(drv_name, "drv_name");
}